

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void int_plus(IntVar *x,IntVar *y,IntVar *z)

{
  vec<IntVar_*> w;
  vec<int> coeffs;
  BoolView *in_stack_000000f8;
  int in_stack_00000100;
  IntRelType in_stack_00000104;
  vec<IntVar_*> *in_stack_00000108;
  vec<int> *in_stack_00000110;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  vec<IntVar_*> *in_stack_ffffffffffffffc0;
  vec<IntVar_*> local_38;
  vec<int> local_28 [2];
  
  vec<int>::vec(local_28);
  vec<IntVar_*>::vec(&local_38);
  uVar3 = 1;
  vec<int>::push((vec<int> *)in_stack_ffffffffffffffc0,(int *)CONCAT44(in_stack_ffffffffffffffbc,1))
  ;
  vec<IntVar_*>::push(in_stack_ffffffffffffffc0,(IntVar **)CONCAT44(in_stack_ffffffffffffffbc,uVar3)
                     );
  uVar2 = 1;
  vec<int>::push((vec<int> *)in_stack_ffffffffffffffc0,
                 (int *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  vec<IntVar_*>::push(in_stack_ffffffffffffffc0,(IntVar **)CONCAT44(in_stack_ffffffffffffffbc,uVar3)
                     );
  uVar1 = 0xffffffff;
  vec<int>::push((vec<int> *)in_stack_ffffffffffffffc0,
                 (int *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  vec<IntVar_*>::push(in_stack_ffffffffffffffc0,(IntVar **)CONCAT44(in_stack_ffffffffffffffbc,uVar3)
                     );
  int_linear(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_00000100,
             in_stack_000000f8);
  vec<IntVar_*>::~vec((vec<IntVar_*> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

void int_plus(IntVar* x, IntVar* y, IntVar* z) {
	vec<int> coeffs;
	vec<IntVar*> w;
	coeffs.push(1);
	w.push(x);
	coeffs.push(1);
	w.push(y);
	coeffs.push(-1);
	w.push(z);
	int_linear(coeffs, w, IRT_EQ, 0);
}